

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::SummarizeBins
          (BamStandardIndex *this,BaiReferenceSummary *refSummary)

{
  int iVar1;
  undefined4 extraout_var;
  int numBins;
  int32_t numAlignmentChunks;
  uint32_t binId;
  int local_2c;
  int32_t local_28;
  uint32_t local_24;
  
  ReadNumBins(this,&local_2c);
  refSummary->NumBins = local_2c;
  iVar1 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
  refSummary->FirstBinFilePosition = CONCAT44(extraout_var,iVar1);
  if (0 < local_2c) {
    iVar1 = 0;
    do {
      ReadBinIntoBuffer(this,&local_24,&local_28);
      iVar1 = iVar1 + 1;
    } while (iVar1 < local_2c);
  }
  return;
}

Assistant:

void BamStandardIndex::SummarizeBins(BaiReferenceSummary& refSummary)
{

    // load number of bins
    int numBins;
    ReadNumBins(numBins);

    // store bins summary for this reference
    refSummary.NumBins = numBins;
    refSummary.FirstBinFilePosition = Tell();

    // skip this reference's bins
    SkipBins(numBins);
}